

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::LoadOccurrence<occurrence_granular>(occurrence_granular *occ,FILE *fin)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  undefined1 auVar5 [16];
  _Node_iterator_base<std::pair<const_int,_double>,_false> local_48;
  _Node_iterator_base<std::pair<const_int,_double>,_false> local_40;
  double local_38;
  double weighting;
  double defaultWeighting;
  double factor;
  size_t i;
  FILE *fin_local;
  occurrence_granular *occ_local;
  
  i = (size_t)fin;
  fin_local = (FILE *)occ;
  factor = (double)fread(&nPeriods_,4,1,(FILE *)fin);
  sVar3 = std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::size((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)periodToWeighting_);
  auVar5._8_4_ = (int)(sVar3 >> 0x20);
  auVar5._0_8_ = sVar3;
  auVar5._12_4_ = 0x45300000;
  defaultWeighting =
       (auVar5._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  weighting = 1.0;
  sVar3 = std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::size((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)periodToWeighting_);
  if (sVar3 != 0) {
    weighting = 0.0;
  }
  factor = (double)fread(fin_local,0x10,1,(FILE *)i);
  while (factor != 0.0) {
    local_38 = weighting;
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
         ::find((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)periodToWeighting_,(key_type *)(fin_local + 4));
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
         ::end((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                *)periodToWeighting_);
    bVar2 = std::__detail::operator!=(&local_40,&local_48);
    if (bVar2) {
      pmVar4 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)periodToWeighting_,(key_type *)(fin_local + 4));
      local_38 = *pmVar4 * defaultWeighting;
    }
    dVar1 = local_38;
    pmVar4 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)eventToWeighting_,(key_type *)fin_local);
    *pmVar4 = dVar1 + *pmVar4;
    if (maxPeriodNo_ < *(int *)(fin_local + 4)) {
      maxPeriodNo_ = *(int *)(fin_local + 4);
    }
    factor = (double)fread(fin_local,0x10,1,(FILE *)i);
  }
  if (maxPeriodNo_ <= nPeriods_) {
    fclose((FILE *)i);
    return;
  }
  fprintf(_stderr,"FATAL: Maximum period number exceeds total number of periods in header of %s\n",
          "input/occurrence.bin");
  exit(1);
}

Assistant:

void LoadOccurrence(T &occ, FILE *fin) {

    size_t i = fread(&nPeriods_, sizeof(nPeriods_), 1, fin);
    double factor = (double)periodToWeighting_.size();
    double defaultWeighting = 1.0;
    if (periodToWeighting_.size() > 0) defaultWeighting = 0.0;

    i = fread(&occ, sizeof(occ), 1, fin);
    while (i != 0) {
      double weighting = defaultWeighting;
      if (periodToWeighting_.find(occ.period_no) != periodToWeighting_.end()) {
	weighting = periodToWeighting_[occ.period_no] * factor;
      }
      eventToWeighting_[occ.event_id] += weighting;
      if (maxPeriodNo_ < occ.period_no) maxPeriodNo_ = occ.period_no;
      i = fread(&occ, sizeof(occ), 1, fin);
    }

    if (maxPeriodNo_ > nPeriods_) {
      fprintf(stderr,
	      "FATAL: Maximum period number exceeds total number of periods in header of %s\n",
	      OCCURRENCE_FILE);
      exit(EXIT_FAILURE);
    }

    fclose(fin);

  }